

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_lextree.c
# Opt level: O0

void fsg_psubtree_dump_node(fsg_lextree_t *tree,fsg_pnode_t *node,FILE *fp)

{
  fsg_link_t *pfVar1;
  char *pcVar2;
  char *local_48;
  fsg_link_t *tl;
  int32 i;
  FILE *fp_local;
  fsg_pnode_t *node_local;
  fsg_lextree_t *tree_local;
  
  for (tl._4_4_ = 0; tl._4_4_ <= (int)(uint)node->ppos; tl._4_4_ = tl._4_4_ + 1) {
    fprintf((FILE *)fp,"  ");
  }
  fprintf((FILE *)fp,"%p.@",node);
  fprintf((FILE *)fp," %5d.SS",(ulong)(node->hmm).ssid);
  fprintf((FILE *)fp," %10d.LP",(ulong)(uint)node->logs2prob);
  fprintf((FILE *)fp," %p.SIB",node->sibling);
  pcVar2 = bin_mdef_ciphone_str(tree->mdef,(uint)node->ci_ext);
  fprintf((FILE *)fp," %s.%d",pcVar2,(ulong)node->ppos);
  if ((node->ppos == '\0') || (node->leaf != '\0')) {
    fprintf((FILE *)fp," [");
    for (tl._4_4_ = 0; tl._4_4_ < 4; tl._4_4_ = tl._4_4_ + 1) {
      fprintf((FILE *)fp,"%08x",(ulong)(node->ctxt).bv[tl._4_4_]);
    }
    fprintf((FILE *)fp,"]");
  }
  if (node->leaf == '\0') {
    fprintf((FILE *)fp," %p.NXT",(node->next).succ);
  }
  else {
    pfVar1 = (node->next).fsglink;
    if (pfVar1->wid == -1) {
      local_48 = "(NULL)";
    }
    else {
      local_48 = tree->fsg->vocab[pfVar1->wid];
    }
    fprintf((FILE *)fp," {%s[%d->%d](%d)}",local_48,(ulong)(uint)pfVar1->from_state,
            (ulong)(uint)pfVar1->to_state,(ulong)(uint)pfVar1->logs2prob);
  }
  fprintf((FILE *)fp,"\n");
  return;
}

Assistant:

void fsg_psubtree_dump_node(fsg_lextree_t *tree, fsg_pnode_t *node, FILE *fp)
{    
    int32 i;
    fsg_link_t *tl;

    /* Indentation */
    for (i = 0; i <= node->ppos; i++)
        fprintf(fp, "  ");

    fprintf(fp, "%p.@", node);    /* Pointer used as node
                    		   * ID */
    fprintf(fp, " %5d.SS", hmm_nonmpx_ssid(&node->hmm));
    fprintf(fp, " %10d.LP", node->logs2prob);
    fprintf(fp, " %p.SIB", node->sibling);
    fprintf(fp, " %s.%d", bin_mdef_ciphone_str(tree->mdef, node->ci_ext), node->ppos);
    if ((node->ppos == 0) || node->leaf) {
        fprintf(fp, " [");
        for (i = 0; i < FSG_PNODE_CTXT_BVSZ; i++)
            fprintf(fp, "%08x", node->ctxt.bv[i]);
        fprintf(fp, "]");
    }
    if (node->leaf) {
        tl = node->next.fsglink;
        fprintf(fp, " {%s[%d->%d](%d)}",
                fsg_model_word_str(tree->fsg, tl->wid),
                tl->from_state, tl->to_state, tl->logs2prob);
    } else {
        fprintf(fp, " %p.NXT", node->next.succ);
    }
    fprintf(fp, "\n");

    return;
}